

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O3

void P_UpdateSpecials(void)

{
  if (deathmatch.Value != 0) {
    if (((timelimit.Value != 0.0) || (NAN(timelimit.Value))) &&
       ((int)(timelimit.Value * 35.0 * 60.0) <= level.maptime)) {
      FStringTable::operator()(&GStrings,"TXT_TIMELIMIT");
      Printf("%s\n");
      G_ExitLevel(0,false);
      return;
    }
  }
  return;
}

Assistant:

inline operator int () const { return Value; }